

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.h
# Opt level: O0

set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> * __thiscall
libDAI::FactorGraph::findVars(FactorGraph *this,VarSet *ns)

{
  bool bVar1;
  reference pVVar2;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  *this_00;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *in_RSI;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar3;
  const_iterator n;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *indexes;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  _Rb_tree_const_iterator<unsigned_long> in_stack_ffffffffffffff70;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_28;
  undefined1 local_19;
  
  local_19 = 0;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0xb3f393);
  VarSet::begin((VarSet *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  __gnu_cxx::
  __normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>::
  __normal_iterator<libDAI::Var*>
            ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)in_stack_ffffffffffffff70._M_node,
             (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  while( true ) {
    VarSet::end((VarSet *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_ffffffffffffff70._M_node,
                       (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if (!bVar1) break;
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
             ::operator*(&local_28);
    this_00 = (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
               *)(**(code **)(*(long *)&(in_RSI->_M_t)._M_impl + 0x40))(in_RSI,pVVar2);
    pVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            insert(in_RSI,(value_type_conflict2 *)in_RDI);
    in_stack_ffffffffffffff70 = pVar3.first._M_node;
    in_stack_ffffffffffffff6f = pVar3.second;
    __gnu_cxx::
    __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
    ::operator++(this_00,pVar3.first._M_node._4_4_);
  }
  return in_RDI;
}

Assistant:

virtual std::set<size_t> findVars( VarSet &ns ) const {
                std::set<size_t> indexes;
                for( VarSet::const_iterator n = ns.begin(); n != ns.end(); n++ )
                    indexes.insert( findVar( *n ) );
                return indexes;
            }